

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_3;
  HierarchyInstantiationSyntax *pHVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  ParameterValueAssignmentSyntax *local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x60) == (SyntaxNode *)0x0) {
    local_30 = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    local_30 = (ParameterValueAssignmentSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_40,
                          (BumpAllocator *)__child_stack);
  }
  args_3 = deepClone<slang::syntax::HierarchicalInstanceSyntax>
                     ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)
                      (__fn + 0x68),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  pHVar1 = BumpAllocator::
           emplace<slang::syntax::HierarchyInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_50,&local_30,args_3,&local_40);
  return (int)pHVar1;
}

Assistant:

static SyntaxNode* clone(const HierarchyInstantiationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<HierarchyInstantiationSyntax>(
        *deepClone(node.attributes, alloc),
        node.type.deepClone(alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        *deepClone(node.instances, alloc),
        node.semi.deepClone(alloc)
    );
}